

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_write_string(mbedtls_mpi *X,int radix,char *buf,size_t buflen,size_t *olen)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  size_t k;
  size_t j;
  size_t i;
  undefined1 local_60 [4];
  int c;
  mbedtls_mpi T;
  char *p;
  size_t n;
  int ret;
  size_t *olen_local;
  size_t buflen_local;
  char *buf_local;
  int radix_local;
  mbedtls_mpi *X_local;
  
  n._4_4_ = 0;
  if ((radix < 2) || (0x10 < radix)) {
    return -4;
  }
  p = (char *)mbedtls_mpi_bitlen(X);
  if (3 < radix) {
    p = (char *)((ulong)p >> 1);
  }
  if (0xf < radix) {
    p = (char *)((ulong)p >> 1);
  }
  pcVar3 = p + 3;
  if (buflen < pcVar3 + ((ulong)pcVar3 & 1)) {
    *olen = (size_t)(pcVar3 + ((ulong)pcVar3 & 1));
    return -8;
  }
  T._8_8_ = buf;
  mbedtls_mpi_init((mbedtls_mpi *)local_60);
  olen_local = (size_t *)buflen;
  if (X->s == -1) {
    *(undefined1 *)T._8_8_ = 0x2d;
    olen_local = (size_t *)(buflen - 1);
    T._8_8_ = T._8_8_ + 1;
  }
  if (radix == 0x10) {
    bVar1 = false;
    for (j = (size_t)X->n; j != 0; j = j - 1) {
      for (k = 8; k != 0; k = k - 1) {
        uVar4 = X->p[j - 1] >> (((char)k + -1) * '\b' & 0x3fU);
        uVar2 = (uint)uVar4 & 0xff;
        if ((((uVar4 & 0xff) != 0) || (bVar1)) || (j + k == 2)) {
          pcVar3 = (char *)(T._8_8_ + 1);
          *(char *)T._8_8_ = "0123456789ABCDEF"[(int)(uVar2 / 0x10)];
          T._8_8_ = T._8_8_ + 2;
          *pcVar3 = "0123456789ABCDEF"[(int)(uVar2 % 0x10)];
          bVar1 = true;
        }
      }
    }
  }
  else {
    n._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_60,X);
    if (n._4_4_ != 0) goto LAB_0036724d;
    if ((short)T.p == -1) {
      T.p._0_2_ = 1;
    }
    n._4_4_ = mpi_write_hlp((mbedtls_mpi *)local_60,radix,(char **)&T.s,(size_t)olen_local);
    if (n._4_4_ != 0) goto LAB_0036724d;
  }
  *(undefined1 *)T._8_8_ = 0;
  *olen = (T._8_8_ + 1) - (long)buf;
  T._8_8_ = T._8_8_ + 1;
LAB_0036724d:
  mbedtls_mpi_free((mbedtls_mpi *)local_60);
  return n._4_4_;
}

Assistant:

int mbedtls_mpi_write_string(const mbedtls_mpi *X, int radix,
                             char *buf, size_t buflen, size_t *olen)
{
    int ret = 0;
    size_t n;
    char *p;
    mbedtls_mpi T;
    MPI_VALIDATE_RET(X    != NULL);
    MPI_VALIDATE_RET(olen != NULL);
    MPI_VALIDATE_RET(buflen == 0 || buf != NULL);

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    n = mbedtls_mpi_bitlen(X);   /* Number of bits necessary to present `n`. */
    if (radix >=  4) {
        n >>= 1;                 /* Number of 4-adic digits necessary to present
                                  * `n`. If radix > 4, this might be a strict
                                  * overapproximation of the number of
                                  * radix-adic digits needed to present `n`. */
    }
    if (radix >= 16) {
        n >>= 1;                 /* Number of hexadecimal digits necessary to
                                  * present `n`. */

    }
    n += 1; /* Terminating null byte */
    n += 1; /* Compensate for the divisions above, which round down `n`
             * in case it's not even. */
    n += 1; /* Potential '-'-sign. */
    n += (n & 1);   /* Make n even to have enough space for hexadecimal writing,
                     * which always uses an even number of hex-digits. */

    if (buflen < n) {
        *olen = n;
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    p = buf;
    mbedtls_mpi_init(&T);

    if (X->s == -1) {
        *p++ = '-';
        buflen--;
    }

    if (radix == 16) {
        int c;
        size_t i, j, k;

        for (i = X->n, k = 0; i > 0; i--) {
            for (j = ciL; j > 0; j--) {
                c = (X->p[i - 1] >> ((j - 1) << 3)) & 0xFF;

                if (c == 0 && k == 0 && (i + j) != 2) {
                    continue;
                }

                *(p++) = "0123456789ABCDEF" [c / 16];
                *(p++) = "0123456789ABCDEF" [c % 16];
                k = 1;
            }
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&T, X));

        if (T.s == -1) {
            T.s = 1;
        }

        MBEDTLS_MPI_CHK(mpi_write_hlp(&T, radix, &p, buflen));
    }

    *p++ = '\0';
    *olen = p - buf;

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}